

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O2

int __thiscall
AbstractThresholdConditionChecker::GetStateSinceHeightFor
          (AbstractThresholdConditionChecker *this,CBlockIndex *pindexPrev,Params *params,
          ThresholdConditionCache *cache)

{
  int iVar1;
  ThresholdState TVar2;
  int iVar3;
  ThresholdState TVar4;
  undefined4 extraout_var;
  CBlockIndex **ppCVar5;
  CBlockIndex *pindexPrev_00;
  CBlockIndex *this_00;
  long in_FS_OFFSET;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*this->_vptr_AbstractThresholdConditionChecker[1])(this,params);
  iVar3 = 0;
  if (CONCAT44(extraout_var,iVar1) < 0xfffffffffffffffe) {
    TVar2 = GetStateFor(this,pindexPrev,params,cache);
    iVar3 = 0;
    if (TVar2 != DEFINED) {
      iVar3 = (*this->_vptr_AbstractThresholdConditionChecker[4])(this,params);
      local_40 = CBlockIndex::GetAncestor
                           (pindexPrev,pindexPrev->nHeight - (pindexPrev->nHeight + 1) % iVar3);
      ppCVar5 = inline_assertion_check<true,CBlockIndex_const*>
                          (&local_40,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/versionbits.cpp"
                           ,0xa2,"GetStateSinceHeightFor",
                           "pindexPrev->GetAncestor(pindexPrev->nHeight - ((pindexPrev->nHeight + 1) % nPeriod))"
                          );
      pindexPrev_00 = *ppCVar5;
      do {
        this_00 = pindexPrev_00;
        pindexPrev_00 = CBlockIndex::GetAncestor(this_00,this_00->nHeight - iVar3);
        if (pindexPrev_00 == (CBlockIndex *)0x0) break;
        TVar4 = GetStateFor(this,pindexPrev_00,params,cache);
      } while (TVar4 == TVar2);
      iVar3 = this_00->nHeight + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int AbstractThresholdConditionChecker::GetStateSinceHeightFor(const CBlockIndex* pindexPrev, const Consensus::Params& params, ThresholdConditionCache& cache) const
{
    int64_t start_time = BeginTime(params);
    if (start_time == Consensus::BIP9Deployment::ALWAYS_ACTIVE || start_time == Consensus::BIP9Deployment::NEVER_ACTIVE) {
        return 0;
    }

    const ThresholdState initialState = GetStateFor(pindexPrev, params, cache);

    // BIP 9 about state DEFINED: "The genesis block is by definition in this state for each deployment."
    if (initialState == ThresholdState::DEFINED) {
        return 0;
    }

    const int nPeriod = Period(params);

    // A block's state is always the same as that of the first of its period, so it is computed based on a pindexPrev whose height equals a multiple of nPeriod - 1.
    // To ease understanding of the following height calculation, it helps to remember that
    // right now pindexPrev points to the block prior to the block that we are computing for, thus:
    // if we are computing for the last block of a period, then pindexPrev points to the second to last block of the period, and
    // if we are computing for the first block of a period, then pindexPrev points to the last block of the previous period.
    // The parent of the genesis block is represented by nullptr.
    pindexPrev = Assert(pindexPrev->GetAncestor(pindexPrev->nHeight - ((pindexPrev->nHeight + 1) % nPeriod)));

    const CBlockIndex* previousPeriodParent = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);

    while (previousPeriodParent != nullptr && GetStateFor(previousPeriodParent, params, cache) == initialState) {
        pindexPrev = previousPeriodParent;
        previousPeriodParent = pindexPrev->GetAncestor(pindexPrev->nHeight - nPeriod);
    }

    // Adjust the result because right now we point to the parent block.
    return pindexPrev->nHeight + 1;
}